

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::LipidTransVisitor::internalVisit(LipidTransVisitor *this,StuntDouble *sd)

{
  double *pdVar1;
  double *pdVar2;
  uint i;
  _Base_ptr p_Var3;
  long lVar4;
  RotMat3x3d *pRVar5;
  uint i_1;
  uint j;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Base_ptr p_Var8;
  _Base_ptr this_02;
  Vector<double,_3U> result;
  double *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  _func_int **local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  Vector3d local_68;
  _Base_ptr local_40;
  Snapshot *local_38;
  
  pdVar1 = local_68.super_Vector<double,_3U>.data_ + 2;
  local_68.super_Vector<double,_3U>.data_[0] = (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)&local_98,(string *)sd);
  this_01 = p_Stack_90;
  pdVar2 = local_98;
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = (double *)0x0;
  if ((double *)local_68.super_Vector<double,_3U>.data_[0] != pdVar1) {
    operator_delete((void *)local_68.super_Vector<double,_3U>.data_[0],
                    (long)local_68.super_Vector<double,_3U>.data_[2] + 1);
  }
  if ((_func_int **)pdVar2 == (_func_int **)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var3 = (_Base_ptr)__dynamic_cast(pdVar2,&GenericData::typeinfo,&AtomData::typeinfo);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var8 = (_Base_ptr)0x0;
    if ((p_Var3 != (_Base_ptr)0x0) &&
       (this_00 = this_01, p_Var8 = p_Var3,
       this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    if (p_Var8 != (_Base_ptr)0x0) {
      local_38 = this->info_->sman_->currentSnapshot_;
      p_Var3 = p_Var8[1]._M_parent;
      if (p_Var3 == p_Var8[1]._M_left) {
        p_Var7 = (_Base_ptr)0x0;
        this_02 = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = *(_Base_ptr *)p_Var3;
        this_02 = p_Var3->_M_parent;
        if (this_02 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_02->_M_parent = *(int *)&this_02->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_02->_M_parent = *(int *)&this_02->_M_parent + 1;
          }
        }
      }
      local_40 = p_Var8;
      if (p_Var7 != (_Base_ptr)0x0) {
        local_70 = this_01;
        p_Var8 = this_02;
        local_78 = this_00;
        do {
          local_98 = (double *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88 = (_func_int **)0x0;
          lVar4 = 0;
          do {
            (&local_98)[lVar4] =
                 (double *)
                 ((double)(&p_Var7[1]._M_parent)[lVar4] -
                 (this->origin_).super_Vector<double,_3U>.data_[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          local_68.super_Vector<double,_3U>.data_[2] = (double)local_88;
          local_68.super_Vector<double,_3U>.data_[0] = (double)local_98;
          local_68.super_Vector<double,_3U>.data_[1] = (double)p_Stack_90;
          Snapshot::wrapVector(local_38,&local_68);
          local_98 = (double *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88 = (_func_int **)0x0;
          lVar4 = 0;
          pRVar5 = &this->rotMat_;
          do {
            pdVar1 = (&local_98)[lVar4];
            lVar6 = 0;
            do {
              pdVar1 = (double *)
                       ((double)pdVar1 +
                       (pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0][lVar6] * local_68.super_Vector<double,_3U>.data_[lVar6]);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            (&local_98)[lVar4] = pdVar1;
            lVar4 = lVar4 + 1;
            pRVar5 = (RotMat3x3d *)
                     ((pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     + 1);
          } while (lVar4 != 3);
          lVar4 = 0;
          do {
            (&p_Var7[1]._M_parent)[lVar4] = (_Base_ptr)(&local_98)[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          local_98 = (double *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88 = (_func_int **)0x0;
          lVar4 = 0;
          pRVar5 = &this->rotMat_;
          do {
            pdVar1 = (&local_98)[lVar4];
            lVar6 = 0;
            do {
              pdVar1 = (double *)
                       ((double)pdVar1 +
                       (pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_[0][lVar6] * *(double *)(&p_Var7[2]._M_color + lVar6 * 2));
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            (&local_98)[lVar4] = pdVar1;
            lVar4 = lVar4 + 1;
            pRVar5 = (RotMat3x3d *)
                     ((pRVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     + 1);
          } while (lVar4 != 3);
          lVar4 = 0;
          do {
            *(double **)(&p_Var7[2]._M_color + lVar4 * 2) = (&local_98)[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          if ((_Base_ptr)&p_Var3->_M_left == local_40[1]._M_left) {
            p_Var7 = (_Base_ptr)0x0;
            this_02 = (_Base_ptr)0x0;
          }
          else {
            p_Var7 = p_Var3->_M_left;
            this_02 = p_Var3->_M_right;
            if (this_02 != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&this_02->_M_parent = *(int *)&this_02->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&this_02->_M_parent = *(int *)&this_02->_M_parent + 1;
              }
            }
          }
          if (p_Var8 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8);
          }
          this_00 = local_78;
          this_01 = local_70;
          p_Var8 = this_02;
          p_Var3 = (_Base_ptr)&p_Var3->_M_left;
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      goto LAB_0021d7d7;
    }
  }
  this_02 = (_Base_ptr)0x0;
LAB_0021d7d7:
  if (this_02 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void LipidTransVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      Vector3d tmp = atomInfo->pos - origin_;
      currSnapshot->wrapVector(tmp);
      atomInfo->pos = rotMat_ * tmp;
      ;
      atomInfo->vec = rotMat_ * atomInfo->vec;
    }
  }